

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int nn_recvmsg(int s,nn_msghdr *msghdr,int flags)

{
  int *piVar1;
  void *pvVar2;
  size_t sVar3;
  undefined8 *puVar4;
  ulong uVar5;
  size_t sVar6;
  char *pcVar7;
  long *in_RSI;
  char *ptr;
  nn_sock *sock;
  nn_cmsghdr *chdr;
  size_t sptotalsz;
  size_t spsz;
  size_t ctrlsz;
  void *ctrl;
  size_t hdrssz;
  void *chunk;
  nn_iovec *iov;
  int i;
  size_t sz;
  uint8_t *data;
  nn_msg msg;
  int rc;
  int in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  int iVar8;
  void **in_stack_fffffffffffffef8;
  nn_sock *in_stack_ffffffffffffff00;
  nn_chunkref *in_stack_ffffffffffffff08;
  FILE *__stream;
  nn_msg *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  ulong local_b8;
  ulong *local_b0;
  size_t local_a8;
  int local_8c;
  ulong local_88;
  void *local_80;
  nn_chunkref local_78;
  nn_chunkref nStack_58;
  nn_chunkref nStack_38;
  int local_18;
  long *local_10;
  
  local_10 = in_RSI;
  local_18 = nn_global_hold_socket
                       ((nn_sock **)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                        in_stack_fffffffffffffeec);
  if (local_18 < 0) {
    iVar8 = -local_18;
    piVar1 = __errno_location();
    *piVar1 = iVar8;
  }
  else {
    if (local_10 == (long *)0x0) {
      local_18 = -0x16;
    }
    else if ((int)local_10[1] < 0) {
      local_18 = -0x5a;
    }
    else {
      local_18 = nn_sock_recv((nn_sock *)
                              CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                              in_stack_ffffffffffffff10,
                              (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      if (-1 < local_18) {
        if (((int)local_10[1] == 1) && (*(long *)(*local_10 + 8) == -1)) {
          pvVar2 = nn_chunkref_getchunk(in_stack_ffffffffffffff08);
          **(undefined8 **)*local_10 = pvVar2;
          sVar3 = nn_chunk_size((void *)0x12391f);
          local_88._0_4_ = (int)sVar3;
        }
        else {
          local_80 = nn_chunkref_data(&nStack_38);
          local_88 = nn_chunkref_size((nn_chunkref *)
                                      CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))
          ;
          for (local_8c = 0; local_8c != (int)local_10[1]; local_8c = local_8c + 1) {
            puVar4 = (undefined8 *)(*local_10 + (long)local_8c * 0x10);
            if (puVar4[1] == -1) {
              nn_msg_term((nn_msg *)0x1239cd);
              local_18 = -0x16;
              goto LAB_00123d4d;
            }
            if (local_88 < (ulong)puVar4[1]) {
              memcpy((void *)*puVar4,local_80,local_88);
              break;
            }
            memcpy((void *)*puVar4,local_80,puVar4[1]);
            local_80 = (void *)(puVar4[1] + (long)local_80);
            local_88 = local_88 - puVar4[1];
          }
          sVar3 = nn_chunkref_size((nn_chunkref *)
                                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
          local_88._0_4_ = (int)sVar3;
        }
        if (local_10[2] != 0) {
          sVar3 = nn_chunkref_size((nn_chunkref *)
                                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
          uVar5 = (sVar3 + 0xf & 0xfffffffffffffff8) + 0x10;
          local_b8 = uVar5;
          sVar6 = nn_chunkref_size((nn_chunkref *)
                                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
          local_b8 = local_b8 + sVar6;
          if (local_10[3] == -1) {
            local_18 = nn_chunk_alloc((size_t)in_stack_ffffffffffffff08,
                                      (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                                      in_stack_fffffffffffffef8);
            if (local_18 != 0) {
              nn_backtrace_print();
              __stream = _stderr;
              pcVar7 = nn_err_strerror(in_stack_fffffffffffffeec);
              fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar7,(ulong)(uint)-local_18,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/global.c"
                      ,0x39a);
              fflush(_stderr);
              nn_err_abort();
            }
            *(ulong **)local_10[2] = local_b0;
            local_18 = 0;
          }
          else {
            local_b0 = (ulong *)local_10[2];
            local_b8 = local_10[3];
          }
          if (uVar5 <= local_b8) {
            *local_b0 = uVar5;
            *(undefined4 *)(local_b0 + 1) = 1;
            *(undefined4 *)((long)local_b0 + 0xc) = 1;
            local_b0[2] = sVar3;
            in_stack_ffffffffffffff00 = (nn_sock *)(local_b0 + 3);
            pvVar2 = nn_chunkref_data(&local_78);
            memcpy(in_stack_ffffffffffffff00,pvVar2,sVar3);
            local_a8 = nn_chunkref_size((nn_chunkref *)
                                        CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0
                                                ));
            if (local_b8 - uVar5 < local_a8) {
              local_a8 = local_b8 - uVar5;
            }
            in_stack_fffffffffffffef8 = (void **)((long)local_b0 + uVar5);
            pvVar2 = nn_chunkref_data(&nStack_58);
            memcpy(in_stack_fffffffffffffef8,pvVar2,local_a8);
          }
        }
        iVar8 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
        nn_msg_term((nn_msg *)0x123d07);
        nn_sock_stat_increment
                  (in_stack_ffffffffffffff00,iVar8,
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        nn_sock_stat_increment
                  (in_stack_ffffffffffffff00,iVar8,
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        nn_global_rele_socket((nn_sock *)0x123d3c);
        return (int)local_88;
      }
    }
LAB_00123d4d:
    nn_global_rele_socket((nn_sock *)0x123d57);
    iVar8 = -local_18;
    piVar1 = __errno_location();
    *piVar1 = iVar8;
  }
  return -1;
}

Assistant:

int nn_recvmsg (int s, struct nn_msghdr *msghdr, int flags)
{
    int rc;
    struct nn_msg msg;
    uint8_t *data;
    size_t sz;
    int i;
    struct nn_iovec *iov;
    void *chunk;
    size_t hdrssz;
    void *ctrl;
    size_t ctrlsz;
    size_t spsz;
    size_t sptotalsz;
    struct nn_cmsghdr *chdr;
    struct nn_sock *sock;

    rc = nn_global_hold_socket (&sock, s);
    if (nn_slow (rc < 0)) {
        errno = -rc;
        return -1;
    }

    if (nn_slow (!msghdr)) {
        rc = -EINVAL;
        goto fail;
    }

    if (nn_slow (msghdr->msg_iovlen < 0)) {
        rc = -EMSGSIZE;
        goto fail;
    }

    /*  Get a message. */
    rc = nn_sock_recv (sock, &msg, flags);
    if (nn_slow (rc < 0)) {
        goto fail;
    }

    if (msghdr->msg_iovlen == 1 && msghdr->msg_iov [0].iov_len == NN_MSG) {
        chunk = nn_chunkref_getchunk (&msg.body);
        *(void**) (msghdr->msg_iov [0].iov_base) = chunk;
        sz = nn_chunk_size (chunk);
    }
    else {

        /*  Copy the message content into the supplied gather array. */
        data = nn_chunkref_data (&msg.body);
        sz = nn_chunkref_size (&msg.body);
        for (i = 0; i != msghdr->msg_iovlen; ++i) {
            iov = &msghdr->msg_iov [i];
            if (nn_slow (iov->iov_len == NN_MSG)) {
                nn_msg_term (&msg);
                rc = -EINVAL;
                goto fail;
            }
            if (iov->iov_len > sz) {
                memcpy (iov->iov_base, data, sz);
                break;
            }
            memcpy (iov->iov_base, data, iov->iov_len);
            data += iov->iov_len;
            sz -= iov->iov_len;
        }
        sz = nn_chunkref_size (&msg.body);
    }

    /*  Retrieve the ancillary data from the message. */
    if (msghdr->msg_control) {

        spsz = nn_chunkref_size (&msg.sphdr);
        sptotalsz = NN_CMSG_SPACE (spsz+sizeof (size_t));
        ctrlsz = sptotalsz + nn_chunkref_size (&msg.hdrs);

        if (msghdr->msg_controllen == NN_MSG) {

            /* Allocate the buffer. */
            rc = nn_chunk_alloc (ctrlsz, 0, &ctrl);
            errnum_assert (rc == 0, -rc);

            /* Set output parameters. */
            *((void**) msghdr->msg_control) = ctrl;
        }
        else {

            /* Just use the buffer supplied by the user. */
            ctrl = msghdr->msg_control;
            ctrlsz = msghdr->msg_controllen;
        }

        /* If SP header alone won't fit into the buffer, return no ancillary
           properties. */
        if (ctrlsz >= sptotalsz) {
            char *ptr;

            /*  Fill in SP_HDR ancillary property. */
            chdr = (struct nn_cmsghdr*) ctrl;
            chdr->cmsg_len = sptotalsz;
            chdr->cmsg_level = PROTO_SP;
            chdr->cmsg_type = SP_HDR;
            ptr = (void *)chdr;
            ptr += sizeof (*chdr);
            *(size_t *)(void *)ptr = spsz;
            ptr += sizeof (size_t);
            memcpy (ptr, nn_chunkref_data (&msg.sphdr), spsz);

            /*  Fill in as many remaining properties as possible.
                Truncate the trailing properties if necessary. */
            hdrssz = nn_chunkref_size (&msg.hdrs);
            if (hdrssz > ctrlsz - sptotalsz)
                hdrssz = ctrlsz - sptotalsz;
            memcpy (((char*) ctrl) + sptotalsz,
                nn_chunkref_data (&msg.hdrs), hdrssz);
        }
    }

    nn_msg_term (&msg);

    /*  Adjust the statistics. */
    nn_sock_stat_increment (sock, NN_STAT_MESSAGES_RECEIVED, 1);
    nn_sock_stat_increment (sock, NN_STAT_BYTES_RECEIVED, sz);

    nn_global_rele_socket (sock);

    return (int) sz;

fail:
    nn_global_rele_socket (sock);

    errno = -rc;
    return -1;
}